

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O0

VarType * __thiscall
deqp::gles31::Functional::anon_unknown_1::RandomSSBOLayoutCase::generateType
          (VarType *__return_storage_ptr__,RandomSSBOLayoutCase *this,Random *rnd,int typeDepth,
          bool arrayOk,bool unsizedArrayOk)

{
  pointer *__return_storage_ptr___00;
  bool bVar1;
  int iVar2;
  DataType dataType;
  char *pcVar3;
  StructType *pSVar4;
  reference type_00;
  iterator first;
  iterator last;
  VarType *pVVar5;
  float fVar6;
  Precision local_20c;
  Precision precision;
  value_type local_1f0;
  DataType type;
  value_type local_1e8 [22];
  undefined1 local_190 [8];
  vector<glu::DataType,_std::allocator<glu::DataType>_> typeCandidates;
  VarType elementType_1;
  bool childArrayOk_1;
  int arrayLength;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  int local_10c;
  undefined1 local_108 [4];
  int ndx_1;
  allocator<char> local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  StructType *local_a0;
  StructType *structType;
  int local_80;
  int local_7c;
  int ndx;
  int numMembers;
  vector<glu::VarType,_std::allocator<glu::VarType>_> memberTypes;
  undefined1 local_50 [8];
  VarType elementType;
  bool childArrayOk;
  float unsizedArrayWeight;
  float arrayWeight;
  float structWeight;
  bool unsizedArrayOk_local;
  bool arrayOk_local;
  int typeDepth_local;
  Random *rnd_local;
  RandomSSBOLayoutCase *this_local;
  
  elementType.m_data._12_4_ = 0x3f4ccccd;
  pVVar5 = __return_storage_ptr__;
  if ((unsizedArrayOk) && (fVar6 = de::Random::getFloat(rnd), fVar6 < 0.8)) {
    elementType.m_data.array.size._3_1_ = (byte)(this->m_features >> 0xe) & 1;
    generateType((VarType *)local_50,this,rnd,typeDepth,(bool)elementType.m_data.array.size._3_1_,
                 false);
    glu::VarType::VarType(__return_storage_ptr__,(VarType *)local_50,-1);
    glu::VarType::~VarType((VarType *)local_50);
    return __return_storage_ptr__;
  }
  if ((typeDepth < this->m_maxStructDepth) && (fVar6 = de::Random::getFloat(rnd), fVar6 < 0.1)) {
    std::vector<glu::VarType,_std::allocator<glu::VarType>_>::vector
              ((vector<glu::VarType,_std::allocator<glu::VarType>_> *)&ndx);
    local_7c = de::Random::getInt(rnd,1,this->m_maxStructMembers);
    for (local_80 = 0; iVar2 = (int)pVVar5, local_80 < local_7c; local_80 = local_80 + 1) {
      pVVar5 = (VarType *)&DAT_00000001;
      generateType((VarType *)&structType,this,rnd,typeDepth + 1,true,false);
      std::vector<glu::VarType,_std::allocator<glu::VarType>_>::push_back
                ((vector<glu::VarType,_std::allocator<glu::VarType>_> *)&ndx,
                 (value_type *)&structType);
      glu::VarType::~VarType((VarType *)&structType);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"s",&local_e1);
    Functional::(anonymous_namespace)::genName_abi_cxx11_
              ((string *)local_108,(_anonymous_namespace_ *)0x41,'Z',(char)this->m_structNdx,iVar2);
    std::operator+(&local_c0,&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pSVar4 = bb::ShaderInterface::allocStruct(&(this->super_SSBOLayoutCase).m_interface,pcVar3);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)local_108);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    this->m_structNdx = this->m_structNdx + 1;
    local_a0 = pSVar4;
    for (local_10c = 0; pSVar4 = local_a0, local_10c < local_7c; local_10c = local_10c + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&arrayLength,"m",(allocator<char> *)&childArrayOk_1);
      std::operator+(&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &arrayLength,(char)local_10c + 'A');
      pcVar3 = (char *)std::__cxx11::string::c_str();
      type_00 = std::vector<glu::VarType,_std::allocator<glu::VarType>_>::operator[]
                          ((vector<glu::VarType,_std::allocator<glu::VarType>_> *)&ndx,
                           (long)local_10c);
      glu::StructType::addMember(pSVar4,pcVar3,type_00);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&arrayLength);
      std::allocator<char>::~allocator((allocator<char> *)&childArrayOk_1);
    }
    glu::VarType::VarType(__return_storage_ptr__,local_a0);
    std::vector<glu::VarType,_std::allocator<glu::VarType>_>::~vector
              ((vector<glu::VarType,_std::allocator<glu::VarType>_> *)&ndx);
    return __return_storage_ptr__;
  }
  if (((0 < this->m_maxArrayLength) && (arrayOk)) &&
     (fVar6 = de::Random::getFloat(rnd), fVar6 < 0.1)) {
    iVar2 = de::Random::getInt(rnd,1,this->m_maxArrayLength);
    __return_storage_ptr___00 =
         &typeCandidates.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
    generateType((VarType *)__return_storage_ptr___00,this,rnd,typeDepth,
                 (bool)((byte)(this->m_features >> 0xe) & 1),false);
    glu::VarType::VarType(__return_storage_ptr__,(VarType *)__return_storage_ptr___00,iVar2);
    glu::VarType::~VarType
              ((VarType *)
               &typeCandidates.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    return __return_storage_ptr__;
  }
  std::vector<glu::DataType,_std::allocator<glu::DataType>_>::vector
            ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_190);
  local_1e8[0x15] = 1;
  std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
            ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_190,local_1e8 + 0x15);
  local_1e8[0x14] = 0x1b;
  std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
            ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_190,local_1e8 + 0x14);
  local_1e8[0x13] = 0x1f;
  std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
            ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_190,local_1e8 + 0x13);
  local_1e8[0x12] = 0x23;
  std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
            ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_190,local_1e8 + 0x12);
  if ((this->m_features & 1) != 0) {
    local_1e8[0x11] = 2;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_190,local_1e8 + 0x11);
    local_1e8[0x10] = 3;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_190,local_1e8 + 0x10);
    local_1e8[0xf] = 4;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_190,local_1e8 + 0xf);
    local_1e8[0xe] = 0x1c;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_190,local_1e8 + 0xe);
    local_1e8[0xd] = 0x1d;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_190,local_1e8 + 0xd);
    local_1e8[0xc] = 0x1e;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_190,local_1e8 + 0xc);
    local_1e8[0xb] = 0x20;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_190,local_1e8 + 0xb);
    local_1e8[10] = 0x21;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_190,local_1e8 + 10);
    local_1e8[9] = 0x22;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_190,local_1e8 + 9);
    local_1e8[8] = 0x24;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_190,local_1e8 + 8);
    local_1e8[7] = 0x25;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_190,local_1e8 + 7);
    local_1e8[6] = 0x26;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_190,local_1e8 + 6);
  }
  if ((this->m_features & 2) != 0) {
    local_1e8[5] = 5;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_190,local_1e8 + 5);
    local_1e8[4] = 6;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_190,local_1e8 + 4);
    local_1e8[3] = 8;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_190,local_1e8 + 3);
    local_1e8[2] = 9;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_190,local_1e8 + 2);
    local_1e8[1] = 10;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_190,local_1e8 + 1);
    local_1e8[0] = TYPE_FLOAT_MAT4X2;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_190,local_1e8);
    type = TYPE_FLOAT_MAT4X3;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_190,&type);
    local_1f0 = TYPE_FLOAT_MAT4;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_190,&local_1f0);
  }
  first = std::vector<glu::DataType,_std::allocator<glu::DataType>_>::begin
                    ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_190);
  last = std::vector<glu::DataType,_std::allocator<glu::DataType>_>::end
                   ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_190);
  dataType = de::Random::
             choose<glu::DataType,__gnu_cxx::__normal_iterator<glu::DataType*,std::vector<glu::DataType,std::allocator<glu::DataType>>>>
                       (rnd,(__normal_iterator<glu::DataType_*,_std::vector<glu::DataType,_std::allocator<glu::DataType>_>_>
                             )first._M_current,
                        (__normal_iterator<glu::DataType_*,_std::vector<glu::DataType,_std::allocator<glu::DataType>_>_>
                         )last._M_current);
  bVar1 = glu::isDataTypeBoolOrBVec(dataType);
  if (bVar1) {
    local_20c = PRECISION_LAST;
  }
  else {
    local_20c = de::Random::choose<glu::Precision,glu::Precision_const*>
                          (rnd,generateType::precisionCandidates,(Precision *)"Test array.length()")
    ;
  }
  glu::VarType::VarType(__return_storage_ptr__,dataType,local_20c);
  std::vector<glu::DataType,_std::allocator<glu::DataType>_>::~vector
            ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)local_190);
  return __return_storage_ptr__;
}

Assistant:

glu::VarType RandomSSBOLayoutCase::generateType (de::Random& rnd, int typeDepth, bool arrayOk, bool unsizedArrayOk)
{
	const float structWeight		= 0.1f;
	const float arrayWeight			= 0.1f;
	const float	unsizedArrayWeight	= 0.8f;

	DE_ASSERT(arrayOk || !unsizedArrayOk);

	if (unsizedArrayOk && (rnd.getFloat() < unsizedArrayWeight))
	{
		const bool			childArrayOk	= (m_features & FEATURE_ARRAYS_OF_ARRAYS) != 0;
		const glu::VarType	elementType		= generateType(rnd, typeDepth, childArrayOk, false);
		return glu::VarType(elementType, glu::VarType::UNSIZED_ARRAY);
	}
	else if (typeDepth < m_maxStructDepth && rnd.getFloat() < structWeight)
	{
		// \todo [2013-10-14 pyry] Implement unused flags for members!
//		bool					unusedOk			= (m_features & FEATURE_UNUSED_MEMBERS) != 0;
		vector<glu::VarType>	memberTypes;
		int						numMembers = rnd.getInt(1, m_maxStructMembers);

		// Generate members first so nested struct declarations are in correct order.
		for (int ndx = 0; ndx < numMembers; ndx++)
			memberTypes.push_back(generateType(rnd, typeDepth+1, true, false));

		glu::StructType& structType = m_interface.allocStruct((string("s") + genName('A', 'Z', m_structNdx)).c_str());
		m_structNdx += 1;

		DE_ASSERT(numMembers <= 'Z' - 'A');
		for (int ndx = 0; ndx < numMembers; ndx++)
		{
			structType.addMember((string("m") + (char)('A' + ndx)).c_str(), memberTypes[ndx]);
		}

		return glu::VarType(&structType);
	}
	else if (m_maxArrayLength > 0 && arrayOk && rnd.getFloat() < arrayWeight)
	{
		const int			arrayLength		= rnd.getInt(1, m_maxArrayLength);
		const bool			childArrayOk	= (m_features & FEATURE_ARRAYS_OF_ARRAYS) != 0;
		const glu::VarType	elementType		= generateType(rnd, typeDepth, childArrayOk, false);

		return glu::VarType(elementType, arrayLength);
	}
	else
	{
		vector<glu::DataType> typeCandidates;

		typeCandidates.push_back(glu::TYPE_FLOAT);
		typeCandidates.push_back(glu::TYPE_INT);
		typeCandidates.push_back(glu::TYPE_UINT);
		typeCandidates.push_back(glu::TYPE_BOOL);

		if (m_features & FEATURE_VECTORS)
		{
			typeCandidates.push_back(glu::TYPE_FLOAT_VEC2);
			typeCandidates.push_back(glu::TYPE_FLOAT_VEC3);
			typeCandidates.push_back(glu::TYPE_FLOAT_VEC4);
			typeCandidates.push_back(glu::TYPE_INT_VEC2);
			typeCandidates.push_back(glu::TYPE_INT_VEC3);
			typeCandidates.push_back(glu::TYPE_INT_VEC4);
			typeCandidates.push_back(glu::TYPE_UINT_VEC2);
			typeCandidates.push_back(glu::TYPE_UINT_VEC3);
			typeCandidates.push_back(glu::TYPE_UINT_VEC4);
			typeCandidates.push_back(glu::TYPE_BOOL_VEC2);
			typeCandidates.push_back(glu::TYPE_BOOL_VEC3);
			typeCandidates.push_back(glu::TYPE_BOOL_VEC4);
		}

		if (m_features & FEATURE_MATRICES)
		{
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT2);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT2X3);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT3X2);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT3);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT3X4);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT4X2);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT4X3);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT4);
		}

		glu::DataType	type		= rnd.choose<glu::DataType>(typeCandidates.begin(), typeCandidates.end());
		glu::Precision	precision;

		if (!glu::isDataTypeBoolOrBVec(type))
		{
			// Precision.
			static const glu::Precision precisionCandidates[] = { glu::PRECISION_LOWP, glu::PRECISION_MEDIUMP, glu::PRECISION_HIGHP };
			precision = rnd.choose<glu::Precision>(&precisionCandidates[0], &precisionCandidates[DE_LENGTH_OF_ARRAY(precisionCandidates)]);
		}
		else
			precision = glu::PRECISION_LAST;

		return glu::VarType(type, precision);
	}
}